

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadsBody.cpp
# Opt level: O2

void __thiscall
chrono::ChLoadBodyBody::ChLoadBodyBody
          (ChLoadBodyBody *this,shared_ptr<chrono::ChBody> *mbodyA,
          shared_ptr<chrono::ChBody> *mbodyB,ChFrame<double> *abs_application)

{
  __shared_ptr<chrono::ChLoadable,(__gnu_cxx::_Lock_policy)2> local_88 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_80;
  __shared_ptr<chrono::ChLoadable,(__gnu_cxx::_Lock_policy)2> local_78 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  undefined1 local_68 [16];
  double local_58;
  undefined1 local_50 [24];
  double local_38;
  
  std::__shared_ptr<chrono::ChLoadable,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChBody,void>
            (local_78,&mbodyA->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::ChLoadable,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChBody,void>
            (local_88,&mbodyB->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>);
  ChLoadCustomMultiple::ChLoadCustomMultiple
            (&this->super_ChLoadCustomMultiple,(shared_ptr<chrono::ChLoadable> *)local_78,
             (shared_ptr<chrono::ChLoadable> *)local_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70);
  (this->super_ChLoadCustomMultiple).super_ChLoadBase.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChLoadBodyBody_0116cdb0;
  local_50._0_8_ = 1.0;
  local_58 = 0.0;
  local_38 = 0.0;
  local_68 = ZEXT816(0);
  local_50._8_16_ = ZEXT816(0);
  ChFrame<double>::ChFrame
            (&this->loc_application_A,(ChVector<double> *)local_68,(ChQuaternion<double> *)local_50)
  ;
  local_50._0_8_ = 1.0;
  local_58 = 0.0;
  local_38 = 0.0;
  local_68 = ZEXT816(0);
  local_50._8_16_ = ZEXT816(0);
  ChFrame<double>::ChFrame
            (&this->loc_application_B,(ChVector<double> *)local_68,(ChQuaternion<double> *)local_50)
  ;
  (this->locB_force).m_data[2] = 0.0;
  (this->locB_torque).m_data[0] = 0.0;
  (this->locB_torque).m_data[1] = 0.0;
  (this->locB_torque).m_data[2] = 0.0;
  (this->locB_force).m_data[0] = 0.0;
  (this->locB_force).m_data[1] = 0.0;
  (this->locB_force).m_data[2] = 0.0;
  (this->locB_torque).m_data[0] = 0.0;
  local_50._0_8_ = 1.0;
  local_58 = 0.0;
  local_38 = 0.0;
  local_68 = ZEXT416(0) << 0x40;
  local_50._8_16_ = local_68;
  ChFrameMoving<double>::ChFrameMoving
            (&this->frame_Aw,(ChVector<double> *)local_68,(ChQuaternion<double> *)local_50);
  local_50._0_8_ = 1.0;
  local_58 = 0.0;
  local_38 = 0.0;
  local_68 = ZEXT816(0);
  local_50._8_16_ = ZEXT816(0);
  ChFrameMoving<double>::ChFrameMoving
            (&this->frame_Bw,(ChVector<double> *)local_68,(ChQuaternion<double> *)local_50);
  ChFrame<double>::TransformParentToLocal
            ((ChFrame<double> *)
             &((mbodyA->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              super_ChBodyFrame,abs_application,&this->loc_application_A);
  ChFrame<double>::TransformParentToLocal
            ((ChFrame<double> *)
             &((mbodyB->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              super_ChBodyFrame,abs_application,&this->loc_application_B);
  return;
}

Assistant:

ChLoadBodyBody::ChLoadBodyBody(std::shared_ptr<ChBody> mbodyA,
                               std::shared_ptr<ChBody> mbodyB,
                               const ChFrame<>& abs_application)
    : ChLoadCustomMultiple(mbodyA, mbodyB) {
    mbodyA->ChFrame::TransformParentToLocal(abs_application, loc_application_A);
    mbodyB->ChFrame::TransformParentToLocal(abs_application, loc_application_B);
}